

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O2

void __thiscall MethodInfo::Print(MethodInfo *this,ofstream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"name: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,"\n");
  if ((this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    poVar1 = std::operator<<((ostream *)out,"\t");
    poVar1 = std::operator<<(poVar1,"\t");
    std::operator<<(poVar1,"returnType: ");
    TypeInfo::Print((this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,out);
    std::operator<<((ostream *)out,"\n");
  }
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"isPublic: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"arguments: {");
  std::operator<<(poVar1,"\n");
  VariablesInfo::Print
            ((this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             out);
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"} ");
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"fields: {");
  std::operator<<(poVar1,"\n");
  VariablesInfo::Print
            ((this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,out
            );
  poVar1 = std::operator<<((ostream *)out,"\t");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"} ");
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void MethodInfo::Print( std::ofstream& out )
{
	out << "\t" << "\t" << "name: " << name << " " << "\n";
	if( returnType ) {
		out << "\t" << "\t" << "returnType: ";
		returnType->Print( out ); 
		out << "\n";
	}
	out << "\t" << "\t" << "isPublic: " << isPublic << " " << "\n";
	out << "\t" << "\t" << "arguments: {" << "\n";
	arguments->Print( out );
	out << "\t" << "\t" << "} " << "\n";
	out << "\t" << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "\t" << "} " << "\n";
}